

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

string * __thiscall
kratos::ExprOpStr_abi_cxx11_(string *__return_storage_ptr__,kratos *this,ExprOp op)

{
  runtime_error *this_00;
  char *pcVar1;
  char *pcVar2;
  
  switch(this) {
  case (kratos *)0x0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "~";
    pcVar1 = "";
    break;
  case (kratos *)0x1:
  case (kratos *)0x8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "-";
    pcVar1 = "";
    break;
  case (kratos *)0x2:
  case (kratos *)0x7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "+";
    pcVar1 = "";
    break;
  case (kratos *)0x3:
  case (kratos *)0xf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "|";
    pcVar1 = "";
    break;
  case (kratos *)0x4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "!";
    pcVar1 = "";
    break;
  case (kratos *)0x5:
  case (kratos *)0x10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "&";
    pcVar1 = "";
    break;
  case (kratos *)0x6:
  case (kratos *)0x11:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "^";
    pcVar1 = "";
    break;
  case (kratos *)0x9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "/";
    pcVar1 = "";
    break;
  case (kratos *)0xa:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "*";
    pcVar1 = "";
    break;
  case (kratos *)0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "%";
    pcVar1 = "";
    break;
  case (kratos *)0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ">>";
    pcVar1 = "";
    break;
  case (kratos *)0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ">>>";
    pcVar1 = "";
    break;
  case (kratos *)0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "<<";
    pcVar1 = "";
    break;
  case (kratos *)0x12:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "**";
    pcVar1 = "";
    break;
  case (kratos *)0x13:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "&&";
    pcVar1 = "";
    break;
  case (kratos *)0x14:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "||";
    pcVar1 = "";
    break;
  case (kratos *)0x15:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "<";
    pcVar1 = "";
    break;
  case (kratos *)0x16:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ">";
    pcVar1 = "";
    break;
  case (kratos *)0x17:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "<=";
    pcVar1 = "";
    break;
  case (kratos *)0x18:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ">=";
    pcVar1 = "";
    break;
  case (kratos *)0x19:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "==";
    pcVar1 = "";
    break;
  case (kratos *)0x1a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "!=";
    pcVar1 = "";
    break;
  case (kratos *)0x1b:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ":";
    pcVar1 = "";
    break;
  case (kratos *)0x1c:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ",";
    pcVar1 = "";
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unable to find op");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ExprOpStr(ExprOp op) {
    switch (op) {
        case ExprOp::UInvert:
            return "~";
        case ExprOp::UNot:
            return "!";
        case ExprOp::UMinus:
        case ExprOp::Minus:
            return "-";
        case ExprOp::UPlus:
        case ExprOp::Add:
            return "+";
        case ExprOp::Divide:
            return "/";
        case ExprOp::Multiply:
            return "*";
        case ExprOp::Mod:
            return "%";
        case ExprOp::LogicalShiftRight:
            return ">>";
        case ExprOp::SignedShiftRight:
            return ">>>";
        case ExprOp::ShiftLeft:
            return "<<";
        case ExprOp::UOr:
        case ExprOp::Or:
            return "|";
        case ExprOp::UAnd:
        case ExprOp::And:
            return "&";
        case ExprOp::UXor:
        case ExprOp::Xor:
            return "^";
        case ExprOp::LessThan:
            return "<";
        case ExprOp::GreaterThan:
            return ">";
        case ExprOp::LessEqThan:
            return "<=";
        case ExprOp::GreaterEqThan:
            return ">=";
        case ExprOp::Eq:
            return "==";
        case ExprOp::Neq:
            return "!=";
        case ExprOp::Power:
            return "**";
        case ExprOp::Conditional:
            return ":";
        case ExprOp::Concat:
            return ",";
        case ExprOp::LAnd:
            return "&&";
        case ExprOp::LOr:
            return "||";
        default:
            throw std::runtime_error("unable to find op");
    }
}